

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

pair<unsigned_char,_unsigned_int> * createHuffCode(uchar *a,uint number)

{
  long lVar1;
  int local_3c;
  pair<int,_int> local_38;
  int local_30;
  int local_2c;
  int j;
  int i;
  int count;
  int code;
  pair<unsigned_char,_unsigned_int> *ret;
  int si;
  uint number_local;
  uchar *a_local;
  
  ret._0_4_ = 8;
  ret._4_4_ = number;
  _si = a;
  _count = (pair<unsigned_char,_unsigned_int> *)malloc((ulong)(number * 8));
  i = 0;
  j = 0;
  for (local_2c = 0; local_2c < 0x10; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < (int)(uint)_si[local_2c]; local_30 = local_30 + 1) {
      local_3c = local_2c + 1;
      local_38 = std::make_pair<int,int&>(&local_3c,&i);
      lVar1 = (long)j;
      j = j + 1;
      std::pair<unsigned_char,unsigned_int>::operator=
                ((pair<unsigned_char,unsigned_int> *)(_count + lVar1),&local_38);
      i = i + 1;
    }
    i = i << 1;
  }
  return _count;
}

Assistant:

std::pair<unsigned char, unsigned int>* createHuffCode(unsigned char *a, unsigned int number) {
    int si = sizeof(std::pair<unsigned char, unsigned int>);
    auto ret = (std::pair<unsigned char, unsigned int>*)malloc(si * number);
    int code = 0;
    int count = 0;
    for (int i = 0; i < 16; i++) {
        for (int j = 0; j < a[i]; j++) {
            ret[count++] = std::make_pair(i + 1, code);
            code += 1;
        }
        code = code << 1;
    }
    return ret;
}